

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tasgridWrapper.cpp
# Opt level: O0

void __thiscall TasgridWrapper::~TasgridWrapper(TasgridWrapper *this)

{
  TasgridWrapper *this_local;
  
  std::__cxx11::string::~string((string *)&this->description);
  std::__cxx11::string::~string((string *)&this->weightfilename);
  std::__cxx11::string::~string((string *)&this->levellimitfilename);
  std::__cxx11::string::~string((string *)&this->customfilename);
  std::__cxx11::string::~string((string *)&this->conformalfilename);
  std::__cxx11::string::~string((string *)&this->transformfilename);
  std::__cxx11::string::~string((string *)&this->anisofilename);
  std::__cxx11::string::~string((string *)&this->xfilename);
  std::__cxx11::string::~string((string *)&this->valsfilename);
  std::__cxx11::string::~string((string *)&this->outfilename);
  std::__cxx11::string::~string((string *)&this->gridfilename);
  TasGrid::CustomTabulated::~CustomTabulated(&this->ct);
  TasGrid::TasmanianSparseGrid::~TasmanianSparseGrid(&this->grid);
  return;
}

Assistant:

TasgridWrapper::~TasgridWrapper(){}